

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O0

cn_cbor * cn_cbor_bool_create(int boolValue,cn_cbor_errback *errp)

{
  cn_cbor *pcn;
  cn_cbor_errback *errp_local;
  cn_cbor *pcStack_10;
  int boolValue_local;
  
  pcStack_10 = (cn_cbor *)calloc(1,0x38);
  if (pcStack_10 == (cn_cbor *)0x0) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
    pcStack_10 = (cn_cbor *)0x0;
  }
  else {
    pcStack_10->type = (uint)(boolValue != 0);
  }
  return pcStack_10;
}

Assistant:

cn_cbor * cn_cbor_bool_create(int boolValue, CBOR_CONTEXT_COMMA cn_cbor_errback * errp)
{
	cn_cbor * pcn = CN_CALLOC(context);
	if (pcn == NULL) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
		return NULL;
	}

	pcn->type = CN_CBOR_FALSE + (boolValue != 0);
	return pcn;
}